

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::anon_unknown_59::InMemoryFile::Impl::Impl(Impl *this,Clock *clock)

{
  int iVar1;
  undefined4 extraout_var;
  Clock *clock_local;
  Impl *this_local;
  
  this->clock = clock;
  Array<unsigned_char>::Array(&this->bytes);
  this->size = 0;
  iVar1 = (**clock->_vptr_Clock)();
  (this->lastModified).value.value = CONCAT44(extraout_var,iVar1);
  this->mmapCount = 0;
  return;
}

Assistant:

Impl(const Clock& clock): clock(clock), lastModified(clock.now()) {}